

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi)

{
  AV1TplRowMultiThreadSync *tpl_sync;
  ThreadData_conflict *__src;
  uint uVar1;
  uint uVar2;
  AV1_PRIMARY *pAVar3;
  ThreadData_conflict *pTVar4;
  CONV_BUF_TYPE *pCVar5;
  AVxWorker *pAVar6;
  undefined1 *puVar7;
  pthread_mutex_t *ppVar8;
  pthread_cond_t *ppVar9;
  int *piVar10;
  uint8_t *puVar11;
  int16_t *piVar12;
  tran_low_t *ptVar13;
  EncWorkerData *pEVar14;
  EncWorkerData *pEVar15;
  AVxWorkerInterface *pAVar16;
  AVxWorker *pAVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  ulong uVar26;
  long lVar27;
  long lVar28;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  uint uVar25;
  
  pAVar3 = cpi->ppi;
  uVar25 = (cpi->common).mi_params.mb_rows;
  uVar26 = (ulong)uVar25;
  lVar27 = (long)(int)uVar25;
  uVar1 = (cpi->mt_info).num_mod_workers[2];
  uVar2 = (cpi->mt_info).num_workers;
  if ((int)uVar1 < (int)uVar2) {
    uVar2 = uVar1;
  }
  uVar18 = (ulong)uVar2;
  if (uVar25 == (pAVar3->tpl_data).tpl_mt_sync.rows) goto LAB_001c27c6;
  tpl_sync = &(pAVar3->tpl_data).tpl_mt_sync;
  av1_tpl_dealloc(tpl_sync);
  (pAVar3->tpl_data).tpl_mt_sync.rows = uVar25;
  ppVar8 = (pthread_mutex_t *)aom_malloc(lVar27 * 0x28);
  (pAVar3->tpl_data).tpl_mt_sync.mutex_ = ppVar8;
  if (ppVar8 == (pthread_mutex_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate tpl_sync->mutex_"
                      );
    if ((0 < (int)uVar25) && (tpl_sync->mutex_ != (pthread_mutex_t *)0x0)) goto LAB_001c26fd;
  }
  else if (0 < (int)uVar25) {
LAB_001c26fd:
    lVar23 = 0;
    uVar20 = uVar26;
    do {
      pthread_mutex_init((pthread_mutex_t *)((long)tpl_sync->mutex_ + lVar23),
                         (pthread_mutexattr_t *)0x0);
      lVar23 = lVar23 + 0x28;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  ppVar9 = (pthread_cond_t *)aom_malloc(lVar27 * 0x30);
  (pAVar3->tpl_data).tpl_mt_sync.cond_ = ppVar9;
  if (ppVar9 == (pthread_cond_t *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate tpl_sync->cond_")
    ;
    if ((0 < (int)uVar25) && ((pAVar3->tpl_data).tpl_mt_sync.cond_ != (pthread_cond_t *)0x0))
    goto LAB_001c276d;
  }
  else if (0 < (int)uVar25) {
LAB_001c276d:
    lVar23 = 0;
    do {
      pthread_cond_init((pthread_cond_t *)((long)(pAVar3->tpl_data).tpl_mt_sync.cond_ + lVar23),
                        (pthread_condattr_t *)0x0);
      lVar23 = lVar23 + 0x30;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
  }
  piVar10 = (int *)aom_malloc(lVar27 << 2);
  (pAVar3->tpl_data).tpl_mt_sync.num_finished_cols = piVar10;
  if (piVar10 == (int *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate tpl_sync->num_finished_cols");
  }
  (pAVar3->tpl_data).tpl_mt_sync.sync_range = 1;
LAB_001c27c6:
  (pAVar3->tpl_data).tpl_mt_sync.num_threads_working = uVar2;
  (cpi->mt_info).tpl_row_mt.tpl_mt_exit = false;
  memset((pAVar3->tpl_data).tpl_mt_sync.num_finished_cols,0xff,lVar27 << 2);
  if ((int)uVar2 < 1) {
    aom_get_worker_interface();
  }
  else {
    __src = &cpi->td;
    lVar27 = uVar18 - 1;
    pAVar17 = (cpi->mt_info).workers;
    pEVar14 = (cpi->mt_info).tile_thr_data;
    pEVar15 = pEVar14 + lVar27;
    pAVar17[lVar27].hook = tpl_worker_hook;
    pAVar17[lVar27].data1 = pEVar15;
    pAVar17[lVar27].data2 = (void *)0x0;
    pEVar14[lVar27].thread_id = (int)lVar27;
    pEVar14[lVar27].start = (int)lVar27;
    pEVar14[lVar27].cpi = cpi;
    if (lVar27 != 0) {
      iVar22 = uVar2 - 2;
      lVar21 = uVar18 * -0x1d0 + 0x1d0;
      lVar19 = uVar18 * 0x1d0 + -0x3a0;
      lVar28 = uVar18 * 0x38 + -0x48;
      lVar23 = lVar27;
      do {
        pTVar4 = pEVar15->original_td;
        pEVar15->td = pTVar4;
        if (pTVar4 != __src) {
          memcpy(pTVar4,__src,0x256b0);
          av1_init_obmc_buffer(&(pEVar15->td->mb).obmc_buffer);
          pTVar4 = pEVar15->td;
          uVar25 = (uint)(cpi->ppi->tpl_data).tpl_bsize_1d;
          iVar24 = uVar25 * uVar25;
          uVar26 = (ulong)(uint)(iVar24 * 2);
          puVar11 = (uint8_t *)aom_memalign(0x20,uVar26);
          (pTVar4->tpl_tmp_buffers).predictor8 = puVar11;
          piVar12 = (int16_t *)aom_memalign(0x20,uVar26);
          (pTVar4->tpl_tmp_buffers).src_diff = piVar12;
          uVar26 = (ulong)(uint)(iVar24 * 4);
          ptVar13 = (tran_low_t *)aom_memalign(0x20,uVar26);
          (pTVar4->tpl_tmp_buffers).coeff = ptVar13;
          ptVar13 = (tran_low_t *)aom_memalign(0x20,uVar26);
          (pTVar4->tpl_tmp_buffers).qcoeff = ptVar13;
          ptVar13 = (tran_low_t *)aom_memalign(0x20,uVar26);
          (pTVar4->tpl_tmp_buffers).dqcoeff = ptVar13;
          puVar11 = (pTVar4->tpl_tmp_buffers).predictor8;
          if ((((puVar11 == (uint8_t *)0x0) ||
               ((pTVar4->tpl_tmp_buffers).src_diff == (int16_t *)0x0)) ||
              ((pTVar4->tpl_tmp_buffers).coeff == (tran_low_t *)0x0)) ||
             (((pTVar4->tpl_tmp_buffers).qcoeff == (tran_low_t *)0x0 ||
              (ptVar13 == (tran_low_t *)0x0)))) {
            aom_free(puVar11);
            (pTVar4->tpl_tmp_buffers).predictor8 = (uint8_t *)0x0;
            aom_free((pTVar4->tpl_tmp_buffers).src_diff);
            (pTVar4->tpl_tmp_buffers).src_diff = (int16_t *)0x0;
            aom_free((pTVar4->tpl_tmp_buffers).coeff);
            (pTVar4->tpl_tmp_buffers).coeff = (tran_low_t *)0x0;
            aom_free((pTVar4->tpl_tmp_buffers).qcoeff);
            (pTVar4->tpl_tmp_buffers).qcoeff = (tran_low_t *)0x0;
            aom_free((pTVar4->tpl_tmp_buffers).dqcoeff);
            (pTVar4->tpl_tmp_buffers).dqcoeff = (tran_low_t *)0x0;
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
          }
          pTVar4 = pEVar15->td;
          pCVar5 = pTVar4->tmp_conv_dst;
          (pTVar4->mb).tmp_conv_dst = pCVar5;
          (pTVar4->mb).e_mbd.tmp_conv_dst = pCVar5;
          pAVar17 = (cpi->mt_info).workers;
          pEVar14 = (cpi->mt_info).tile_thr_data;
        }
        lVar23 = lVar23 + -1;
        pEVar15 = pEVar14 + lVar23;
        *(code **)((long)pAVar17 + lVar28 + -0x10) = tpl_worker_hook;
        *(char **)((long)pAVar17 + lVar28 + -8) = (pEVar14->error_info).detail + lVar19 + -0x20;
        *(undefined8 *)((long)&pAVar17->impl_ + lVar28) = 0;
        *(int *)((long)&pEVar14->thread_id + lVar19) = iVar22;
        *(int *)((long)&pEVar14->start + lVar19) = iVar22;
        *(AV1_COMP **)((pEVar14->error_info).detail + lVar19 + -0x20) = cpi;
        iVar22 = iVar22 + -1;
        lVar21 = lVar21 + 0x1d0;
        lVar19 = lVar19 + -0x1d0;
        lVar28 = lVar28 + -0x38;
      } while (lVar23 != 0);
      pEVar15 = (EncWorkerData *)((long)pEVar14 - lVar21);
    }
    pEVar15->td = __src;
    pAVar16 = aom_get_worker_interface();
    pAVar6 = (cpi->mt_info).workers;
    pAVar17 = pAVar6 + lVar27;
    pAVar6[lVar27].had_error = 0;
    if (lVar27 != 0) {
      lVar23 = uVar18 * -0x38 + 0x38;
      lVar19 = uVar18 * 0x38 + -0x40;
      do {
        (*pAVar16->launch)(pAVar17);
        lVar27 = lVar27 + -1;
        pAVar6 = (cpi->mt_info).workers;
        pAVar17 = pAVar6 + lVar27;
        *(undefined4 *)((long)&pAVar6->impl_ + lVar19) = 0;
        lVar23 = lVar23 + 0x38;
        lVar19 = lVar19 + -0x38;
      } while (lVar27 != 0);
      pAVar17 = (AVxWorker *)((long)pAVar6 - lVar23);
    }
    (*pAVar16->execute)(pAVar17);
  }
  pAVar16 = aom_get_worker_interface();
  pAVar17 = (cpi->mt_info).workers;
  iVar22 = pAVar17->had_error;
  if (iVar22 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar17->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar2) {
    uVar26 = uVar18 + 1;
    lVar27 = uVar18 * 0x38;
    do {
      pAVar6 = (cpi->mt_info).workers;
      iVar24 = (*pAVar16->sync)((AVxWorker *)((long)&pAVar6[-1].impl_ + lVar27));
      if (iVar24 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar6[-1].data1 + lVar27) + 0x18),0x1a0);
        iVar22 = 1;
      }
      uVar26 = uVar26 - 1;
      lVar27 = lVar27 + -0x38;
    } while (2 < uVar26);
  }
  if (iVar22 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar17->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar2) {
    uVar26 = uVar18 + 1;
    lVar27 = uVar18 * 0x1d0 + -0x1c8;
    do {
      puVar7 = *(undefined1 **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar27 + -0x20);
      if ((ThreadData_conflict *)puVar7 != &cpi->td) {
        aom_free(*(void **)(puVar7 + 0x25dc0));
        *(undefined8 *)(puVar7 + 0x25dc0) = 0;
        aom_free(*(void **)(puVar7 + 0x25dc8));
        *(undefined8 *)(puVar7 + 0x25dc8) = 0;
        aom_free(*(void **)(puVar7 + 0x25dd0));
        *(undefined8 *)(puVar7 + 0x25dd0) = 0;
        aom_free(*(void **)(puVar7 + 0x25dd8));
        *(undefined8 *)(puVar7 + 0x25dd8) = 0;
        aom_free(*(void **)(puVar7 + 0x25de0));
        *(undefined8 *)(puVar7 + 0x25de0) = 0;
      }
      uVar26 = uVar26 - 1;
      lVar27 = lVar27 + -0x1d0;
    } while (1 < uVar26);
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  CommonModeInfoParams *mi_params = &cm->mi_params;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  AV1TplRowMultiThreadSync *tpl_sync = &tpl_data->tpl_mt_sync;
  int mb_rows = mi_params->mb_rows;
  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TPL], mt_info->num_workers);

  if (mb_rows != tpl_sync->rows) {
    av1_tpl_dealloc(tpl_sync);
    av1_tpl_alloc(tpl_sync, cm, mb_rows);
  }
  tpl_sync->num_threads_working = num_workers;
  mt_info->tpl_row_mt.tpl_mt_exit = false;

  // Initialize cur_mb_col to -1 for all MB rows.
  memset(tpl_sync->num_finished_cols, -1,
         sizeof(*tpl_sync->num_finished_cols) * mb_rows);

  prepare_tpl_workers(cpi, tpl_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
#if CONFIG_BITRATE_ACCURACY
  tpl_accumulate_txfm_stats(&cpi->td, &cpi->mt_info, num_workers);
#endif  // CONFIG_BITRATE_ACCURACY
  for (int i = num_workers - 1; i >= 0; i--) {
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];
    ThreadData *td = thread_data->td;
    if (td != &cpi->td) tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
  }
}